

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O1

void __thiscall spatial_region::compute_rho(spatial_region *this)

{
  cellj *pcVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  cellj ***pppcVar6;
  cellj *pcVar7;
  pointer pfVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  particle *p;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar25 [64];
  
  iVar2 = this->nx;
  if (0 < (long)iVar2) {
    uVar3 = this->ny;
    uVar4 = this->nz;
    lVar11 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (0 < (int)uVar3) {
        pppcVar6 = (this->cj).p._M_t.
                   super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                   super__Head_base<0UL,_cellj_***,_false>._M_head_impl;
        iVar5 = this->n_ion_populations;
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vpbroadcastq_avx512f();
        auVar21 = vpsllq_avx512f(auVar21,3);
        puVar12 = (undefined8 *)0x0;
        do {
          if (0 < (int)uVar4) {
            pcVar7 = pppcVar6[lVar11][(long)puVar12];
            pfVar8 = (this->irho).
                     super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start;
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vpsllq_avx512f(auVar22,3);
            uVar16 = 0;
            do {
              pcVar1 = pcVar7 + uVar16;
              pcVar1->jx = 0.0;
              pcVar1->jy = 0.0;
              pcVar7[uVar16].jz = 0.0;
              if (0 < iVar5) {
                auVar23 = vpbroadcastq_avx512f();
                auVar23 = vpsllq_avx512f(auVar23,3);
                auVar24 = vmovdqa64_avx512f(auVar17);
                uVar13 = (ulong)(iVar5 + 7U & 0xfffffff8);
                do {
                  uVar10 = vpcmpuq_avx512f(auVar24,auVar20,2);
                  vpmullq_avx512dq(auVar24,auVar18);
                  auVar25 = vpgatherqq_avx512f(*(undefined8 *)
                                                ((long)&(pfVar8->p)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<double_**,_std::default_delete<double_**[]>_>
                                                  ._M_t + (long)puVar12));
                  bVar9 = (byte)uVar10;
                  auVar26._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar25._8_8_;
                  auVar26._0_8_ = (ulong)(bVar9 & 1) * auVar25._0_8_;
                  auVar26._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar25._16_8_;
                  auVar26._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar25._24_8_;
                  auVar26._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar25._32_8_;
                  auVar26._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar25._40_8_;
                  auVar26._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar25._48_8_;
                  auVar26._56_8_ = (uVar10 >> 7) * auVar25._56_8_;
                  vpaddq_avx512f(auVar26,auVar21);
                  auVar25 = vpgatherqq_avx512f(*puVar12);
                  auVar27._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar25._8_8_;
                  auVar27._0_8_ = (ulong)(bVar9 & 1) * auVar25._0_8_;
                  auVar27._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar25._16_8_;
                  auVar27._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar25._24_8_;
                  auVar27._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar25._32_8_;
                  auVar27._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar25._40_8_;
                  auVar27._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar25._48_8_;
                  auVar27._56_8_ = (uVar10 >> 7) * auVar25._56_8_;
                  vpaddq_avx512f(auVar27,auVar22);
                  auVar25 = vpgatherqq_avx512f(*puVar12);
                  auVar28._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar25._8_8_;
                  auVar28._0_8_ = (ulong)(bVar9 & 1) * auVar25._0_8_;
                  auVar28._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar25._16_8_;
                  auVar28._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar25._24_8_;
                  auVar28._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar25._32_8_;
                  auVar28._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar25._40_8_;
                  auVar28._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar25._48_8_;
                  auVar28._56_8_ = (uVar10 >> 7) * auVar25._56_8_;
                  auVar25 = vpaddq_avx512f(auVar28,auVar23);
                  vscatterqpd_avx512f(ZEXT864(0) + auVar25,uVar10,ZEXT864(0) << 0x40);
                  auVar24 = vpaddq_avx512f(auVar24,auVar19);
                  uVar13 = uVar13 - 8;
                } while (uVar13 != 0);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar4);
          }
          puVar12 = (undefined8 *)((long)puVar12 + 1);
        } while (puVar12 != (undefined8 *)(ulong)uVar3);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  if (0 < this->nx) {
    lVar11 = 0;
    do {
      if (0 < this->ny) {
        lVar14 = 0;
        do {
          if (0 < this->nz) {
            lVar15 = 0;
            do {
              for (p = (this->cp).p._M_t.
                       super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                       super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar11][lVar14][lVar15].
                       pl.start; p != (particle *)0x0; p = p->next) {
                rhodeposition(this,p);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < this->nz);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < this->ny);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->nx);
  }
  return;
}

Assistant:

void spatial_region::compute_rho()
{
    particle* current;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                cj[i][j][k].jx = 0;
                cj[i][j][k].jy = 0;
                cj[i][j][k].jz = 0;
                for (int n=0;n<n_ion_populations;n++)
                    irho[n][i][j][k] = 0;
            }
        }
    }
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                current = cp[i][j][k].pl.start;
                while(current!=0)
                {
                    rhodeposition(*current);
                    current = current->next;
                }
            }
        }
    }
}